

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyb_gga_xc_hse.c
# Opt level: O0

void hyb_gga_xc_hse_sol_init(xc_func_type *p)

{
  xc_func_type *in_RDI;
  double funcs_coef [3];
  int funcs_id [3];
  double par;
  char *name;
  xc_func_type *in_stack_ffffffffffffffe0;
  
  par = -0.25;
  name = (char *)0x3ff0000000000000;
  xc_mix_init(in_stack_ffffffffffffffe0,0x3ff00000,(int *)0xbfd0000000000000,
              (double *)0x3ff0000000000000);
  xc_hyb_init_sr(in_RDI,0.25,0.11);
  xc_func_set_ext_params_name(in_stack_ffffffffffffffe0,name,par);
  xc_func_set_ext_params_name(in_stack_ffffffffffffffe0,name,par);
  return;
}

Assistant:

static void
hyb_gga_xc_hse_sol_init(xc_func_type *p)
{
  int   funcs_id  [3] = {XC_GGA_X_HJS_PBE_SOL, XC_GGA_X_HJS_PBE_SOL, XC_GGA_C_PBE};
  double funcs_coef[3] = {1.0, -0.25, 1.0};

  xc_mix_init(p, 3, funcs_id, funcs_coef);
  xc_hyb_init_sr(p, 0.25, 0.11);

  xc_func_set_ext_params_name(p->func_aux[0], "_omega", 0.0);
  xc_func_set_ext_params_name(p->func_aux[1], "_omega", p->cam_omega);
}